

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O3

int32 vector_is_nan(float32 *vec,int32 len)

{
  ulong uVar1;
  
  if (0 < len) {
    uVar1 = 0;
    do {
      if (NAN((float)vec[uVar1])) {
        return 1;
      }
      uVar1 = uVar1 + 1;
    } while ((uint)len != uVar1);
  }
  return 0;
}

Assistant:

int32
vector_is_nan(float32 * vec, int32 len)
{
    int32 i;
    int result;
    for (i = 0; i < len; i++) {
#if defined(WIN32)
        result = _isnan(vec[i]);
#else
        result = isnan(vec[i]);
#endif
	if (result)
	    return 1;
    }
    return 0;
}